

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O3

void __thiscall
MipTimer::csvEvaluateRootNodeClock
          (MipTimer *this,string *model_name,HighsTimerClock *mip_timer_clock,bool header,
          bool end_line)

{
  pointer pcVar1;
  initializer_list<int> __l;
  allocator_type local_e9;
  string local_e8;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> mip_clock_list;
  string local_98;
  int local_78 [18];
  
  local_78[0xc] = 0x1f;
  local_78[0xd] = 0x20;
  local_78[0xe] = 0x21;
  local_78[0xf] = 0x22;
  local_78[8] = 0x1b;
  local_78[9] = 0x1c;
  local_78[10] = 0x1d;
  local_78[0xb] = 0x1e;
  local_78[4] = 0x17;
  local_78[5] = 0x18;
  local_78[6] = 0x19;
  local_78[7] = 0x1a;
  local_78[0] = 0x13;
  local_78[1] = 0x14;
  local_78[2] = 0x15;
  local_78[3] = 0x16;
  __l._M_len = 0x10;
  __l._M_array = local_78;
  std::vector<int,_std::allocator<int>_>::vector(&mip_clock_list,__l,&local_e9);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"csvRootNode","");
  pcVar1 = (model_name->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + model_name->_M_string_length);
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,&mip_clock_list);
  csvMipClockList(this,&local_e8,&local_98,&local_c8,mip_timer_clock,8,header,end_line);
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (mip_clock_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(mip_clock_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void csvEvaluateRootNodeClock(const std::string model_name,
                                const HighsTimerClock& mip_timer_clock,
                                const bool header, const bool end_line) {
    const std::vector<HighsInt> mip_clock_list{
        kMipClockStartSymmetryDetection,
        kMipClockStartAnalyticCentreComputation,
        kMipClockEvaluateRootLp,
        kMipClockSeparateLpCuts,
        kMipClockRandomizedRounding,
        kMipClockPerformRestart,
        kMipClockRootSeparation,
        kMipClockFinishAnalyticCentreComputation,
        kMipClockRootCentralRounding,
        kMipClockRootSeparationRound0,
        kMipClockRootHeuristicsReducedCost,
        kMipClockRootSeparationRound1,
        kMipClockRootHeuristicsRens,
        kMipClockRootSeparationRound2,
        kMipClockRootFeasibilityPump,
        kMipClockRootSeparationRound3};
    csvMipClockList("csvRootNode", model_name, mip_clock_list, mip_timer_clock,
                    kMipClockEvaluateRootNode, header, end_line);
  }